

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

void __thiscall
tchecker::zg::zg_t::build
          (zg_t *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes,
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
          *v,state_status_t mask)

{
  element_type *system;
  state_t *s_00;
  transition_t *t_00;
  tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
  local_60;
  state_status_t local_48 [2];
  state_status_t status;
  undefined1 local_38 [8];
  transition_sptr_t t;
  state_sptr_t s;
  state_status_t mask_local;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *v_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *attributes_local;
  zg_t *this_local;
  
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  construct<>((state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
               *)&t);
  syncprod::details::
  transition_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
  ::construct<>((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                 *)local_38);
  system = std::
           __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_system);
  s_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
          ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                       *)&t)->super_state_t;
  t_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
          ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                       *)local_38)->super_transition_t;
  local_48[0] = initialize(system,s_00,t_00,attributes);
  if ((local_48[0] & mask) != 0) {
    if (this->_sharing_type == SHARING) {
      share(this,(state_sptr_t *)&t);
      share(this,(transition_sptr_t *)local_38);
    }
    std::
    make_tuple<unsigned_int&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>&>
              (&local_60,local_48,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                *)&t,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                      *)local_38);
    std::
    vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
    ::push_back(v,&local_60);
    std::
    tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
    ::~tuple(&local_60);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
              *)local_38);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)&t);
  return;
}

Assistant:

void zg_t::build(std::map<std::string, std::string> const & attributes, std::vector<sst_t> & v, tchecker::state_status_t mask)
{
  tchecker::zg::state_sptr_t s = _state_allocator.construct();
  tchecker::zg::transition_sptr_t t = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::zg::initialize(*_system, *s, *t, attributes);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(s);
      share(t);
    }
    v.push_back(std::make_tuple(status, s, t));
  }
}